

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functors.h
# Opt level: O2

float __thiscall
cnn::FBinaryLogLossBackward::operator()(FBinaryLogLossBackward *this,float x,float x_true)

{
  undefined8 uVar1;
  uint uVar2;
  float fVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [64];
  float fVar7;
  
  auVar6._4_60_ = in_register_00001204;
  auVar6._0_4_ = x;
  fVar7 = 0.0;
  if (x != x_true) {
    uVar1 = vcmpss_avx512f(auVar6._0_16_,ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar1 & 1);
    uVar2 = (uint)bVar4 * 0x800000 + (uint)!bVar4 * (int)x;
    uVar1 = vcmpss_avx512f(ZEXT416(uVar2),SUB6416(ZEXT464(0x3f800000),0),0);
    bVar4 = (bool)((byte)uVar1 & 1);
    fVar3 = (float)((uint)bVar4 * 0x3f7ffffe + !bVar4 * uVar2);
    if (x_true == 1.0) {
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar5 = vxorps_avx512vl(ZEXT416((uint)this->d),auVar5);
      fVar7 = auVar5._0_4_;
    }
    else {
      if (x_true != 0.0) {
        return this->d * ((1.0 - x_true) / (1.0 - fVar3) - x_true / fVar3);
      }
      fVar7 = this->d * (1.0 - x_true);
      fVar3 = 1.0 - fVar3;
    }
    fVar7 = fVar7 / fVar3;
  }
  return fVar7;
}

Assistant:

CNN_DEVICE_FUNC inline float operator()(float x, float x_true) const {
    if (x == x_true) return 0;
    if (x == 0.f) x = CNN_DEVICE_MIN;
    if (x == 1.f) x = 0.9999999f;
    if (x_true == 1.f) {
      return d * -x_true / x;
    } else if (x_true == 0.f) {
      return d * (1.f - x_true) / (1.f - x);
    }
    return d * ((1.f - x_true) / (1.f - x) + (-x_true / x));
  }